

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_239::Hasher::Hasher
          (Hasher *this,Expression *curr,bool visitChildren,ExprHasher *custom)

{
  _Rb_tree_header *p_Var1;
  ExpressionStack *this_00;
  size_t *psVar2;
  mapped_type mVar3;
  bool bVar4;
  mapped_type *pmVar5;
  Expression **ppEVar6;
  ulong uVar7;
  key_type local_48;
  Expression *local_38;
  Expression *curr_local;
  
  this->visitChildren = visitChildren;
  this->digest = 0;
  this->internalCounter = 0;
  p_Var1 = &(this->internalNames)._M_t._M_impl.super__Rb_tree_header;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->stack;
  (this->stack).flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->internalNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stack).usedFixed = 0;
  local_38 = curr;
  SmallVector<wasm::Expression_*,_10UL>::push_back(this_00,&local_38);
  local_48.super_IString.str._M_len = (size_t)DELEGATE_CALLER_TARGET;
  local_48.super_IString.str._M_str = DAT_010b25a8;
  if (DAT_010b25a8 != (char *)0x0) {
    mVar3 = this->internalCounter;
    this->internalCounter = mVar3 + 1;
    pmVar5 = std::
             map<wasm::Name,_unsigned_int,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
             ::operator[](&this->internalNames,&local_48);
    *pmVar5 = mVar3;
  }
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) + (this->stack).usedFixed != 0) {
    psVar2 = &this->digest;
    do {
      ppEVar6 = SmallVector<wasm::Expression_*,_10UL>::back(this_00);
      local_38 = *ppEVar6;
      SmallVector<wasm::Expression_*,_10UL>::pop_back(this_00);
      if (local_38 == (Expression *)0x0) {
        uVar7 = *psVar2;
        *psVar2 = (uVar7 >> 4) + uVar7 * 0x1000 + -0x61c8864680b583eb ^ uVar7;
      }
      else {
        uVar7 = *psVar2;
        uVar7 = (uVar7 >> 4) + uVar7 * 0x1000 + -0x61c8864680b583eb + (ulong)local_38->_id ^ uVar7;
        *psVar2 = uVar7;
        *psVar2 = (uVar7 >> 4) + uVar7 * 0x1000 + (local_38->type).id + 0x9e3779b97f4a7c15 ^ uVar7;
        local_48.super_IString.str._M_len = (size_t)local_38;
        if ((custom->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar4 = (*custom->_M_invoker)((_Any_data *)custom,(Expression **)&local_48,psVar2);
        if (!bVar4) {
          hashExpression(this,local_38);
        }
      }
    } while (((long)(this->stack).flexible.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->stack).flexible.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + (this->stack).usedFixed != 0);
  }
  return;
}

Assistant:

Hasher(Expression* curr,
         bool visitChildren,
         ExpressionAnalyzer::ExprHasher custom)
    : visitChildren(visitChildren) {
    stack.push_back(curr);
    // DELEGATE_CALLER_TARGET is a fake target used to denote delegating to
    // the caller. Add it here to prevent the unknown name error.
    noteScopeName(DELEGATE_CALLER_TARGET);

    while (stack.size() > 0) {
      curr = stack.back();
      stack.pop_back();
      if (!curr) {
        // This was an optional child that was not present. Hash a 0 to
        // represent that.
        rehash(digest, 0);
        continue;
      }
      rehash(digest, curr->_id);
      // we often don't need to hash the type, as it is tied to other values
      // we are hashing anyhow, but there are exceptions: for example, a
      // local.get's type is determined by the function, so if we are
      // hashing only expression fragments, then two from different
      // functions may turn out the same even if the type differs. Likewise,
      // if we hash between modules, then we need to take int account
      // call_imports type, etc. The simplest thing is just to hash the
      // type for all of them.
      rehash(digest, curr->type.getID());
      // If the custom hasher handled this expr, then we have nothing to do.
      if (custom(curr, digest)) {
        continue;
      }
      // Hash the contents of the expression normally.
      hashExpression(curr);
    }
  }